

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O0

void Error(char *err,char *obj,bool usage)

{
  ulong local_28;
  size_t i;
  bool usage_local;
  char *obj_local;
  char *err_local;
  
  printf("%s: %s\n",program_name,err);
  if (obj != (char *)0x0) {
    printf(": %s",obj);
  }
  printf("\n");
  if (usage) {
    printf("usage: %s [OPTION]... FILE...\n",program_name);
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      printf("  -%s      %s.\n",generators[local_28].extension,generators[local_28].help);
    }
    printf("  -o PATH Prefix PATH to all generated files.\nFILEs may depend on declarations in earlier files.\nOutput files are named using the base file name of the input,and written to the current directory or the path given by -o.\nexample: %s -c -b schema1.fbs schema2.fbs data.json\n"
           ,program_name);
  }
  exit(1);
}

Assistant:

void Error(const char *err, const char *obj, bool usage) {
  printf("%s: %s\n", program_name, err);
  if (obj) printf(": %s", obj);
  printf("\n");
  if (usage) {
    printf("usage: %s [OPTION]... FILE...\n", program_name);
    for (size_t i = 0; i < sizeof(generators) / sizeof(generators[0]); ++i)
      printf("  -%s      %s.\n", generators[i].extension, generators[i].help);
    printf("  -o PATH Prefix PATH to all generated files.\n"
           "FILEs may depend on declarations in earlier files.\n"
           "Output files are named using the base file name of the input,"
           "and written to the current directory or the path given by -o.\n"
           "example: %s -c -b schema1.fbs schema2.fbs data.json\n",
           program_name);
  }
  exit(1);
}